

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lower_precision.cpp
# Opt level: O2

void anon_unknown.dwarf_62f15::find_lowerable_rvalues_visitor::stack_enter
               (ir_instruction *ir,void *data)

{
  pointer __first;
  ulong uVar1;
  ulong uVar2;
  pointer __result;
  pointer psVar3;
  pointer psVar4;
  undefined8 uVar5;
  _Tp_alloc_type *__alloc;
  allocator<(anonymous_namespace)::find_lowerable_rvalues_visitor::stack_entry> *extraout_RDX;
  ulong uVar6;
  stack_entry *unaff_R13;
  stack_entry entry;
  
  entry.lowerable_children.super__Vector_base<ir_instruction_*,_std::allocator<ir_instruction_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  entry.lowerable_children.super__Vector_base<ir_instruction_*,_std::allocator<ir_instruction_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  entry.lowerable_children.super__Vector_base<ir_instruction_*,_std::allocator<ir_instruction_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  entry.state = (can_lower_state)*(byte *)((long)data + 0x30);
  psVar4 = *(pointer *)((long)data + 0x40);
  entry.instr = ir;
  if (psVar4 == *(pointer *)((long)data + 0x48)) {
    __first = *(pointer *)((long)data + 0x38);
    if ((long)psVar4 - (long)__first == 0x7ffffffffffffff8) {
      uVar5 = std::__throw_length_error("vector::_M_realloc_insert");
      __cxa_begin_catch(uVar5);
      std::
      _Destroy<(anonymous_namespace)::find_lowerable_rvalues_visitor::stack_entry*,(anonymous_namespace)::find_lowerable_rvalues_visitor::stack_entry>
                (unaff_R13,unaff_R13,extraout_RDX);
      operator_delete(unaff_R13);
      uVar5 = __cxa_rethrow();
      __cxa_end_catch();
      std::_Vector_base<ir_instruction_*,_std::allocator<ir_instruction_*>_>::~_Vector_base
                (&entry.lowerable_children.
                  super__Vector_base<ir_instruction_*,_std::allocator<ir_instruction_*>_>);
      _Unwind_Resume(uVar5);
    }
    uVar1 = ((long)psVar4 - (long)__first) / 0x28;
    uVar2 = 1;
    if (psVar4 != __first) {
      uVar2 = uVar1;
    }
    uVar6 = uVar2 + uVar1;
    if (0x333333333333332 < uVar6) {
      uVar6 = 0x333333333333333;
    }
    if (CARRY8(uVar2,uVar1)) {
      uVar6 = 0x333333333333333;
    }
    if (uVar6 == 0) {
      __result = (pointer)0x0;
    }
    else {
      __result = (pointer)operator_new(uVar6 * 0x28);
    }
    __alloc = (_Tp_alloc_type *)(ulong)entry.state;
    psVar3 = __result + uVar1;
    psVar3->state = entry.state;
    psVar3->instr = entry.instr;
    std::vector<ir_instruction_*,_std::allocator<ir_instruction_*>_>::vector
              (&psVar3->lowerable_children,&entry.lowerable_children);
    psVar3 = std::
             vector<(anonymous_namespace)::find_lowerable_rvalues_visitor::stack_entry,_std::allocator<(anonymous_namespace)::find_lowerable_rvalues_visitor::stack_entry>_>
             ::_S_relocate(__first,psVar4,__result,__alloc);
    psVar4 = std::
             vector<(anonymous_namespace)::find_lowerable_rvalues_visitor::stack_entry,_std::allocator<(anonymous_namespace)::find_lowerable_rvalues_visitor::stack_entry>_>
             ::_S_relocate(psVar4,psVar4,psVar3 + 1,__alloc);
    if (__first != (pointer)0x0) {
      operator_delete(__first);
    }
    *(pointer *)((long)data + 0x38) = __result;
    *(pointer *)((long)data + 0x40) = psVar4;
    *(pointer *)((long)data + 0x48) = __result + uVar6;
  }
  else {
    psVar4->state = entry.state;
    psVar4->instr = ir;
    std::vector<ir_instruction_*,_std::allocator<ir_instruction_*>_>::vector
              (&psVar4->lowerable_children,&entry.lowerable_children);
    *(long *)((long)data + 0x40) = *(long *)((long)data + 0x40) + 0x28;
  }
  std::_Vector_base<ir_instruction_*,_std::allocator<ir_instruction_*>_>::~_Vector_base
            (&entry.lowerable_children.
              super__Vector_base<ir_instruction_*,_std::allocator<ir_instruction_*>_>);
  return;
}

Assistant:

void
find_lowerable_rvalues_visitor::stack_enter(class ir_instruction *ir,
                                            void *data)
{
   find_lowerable_rvalues_visitor *state =
      (find_lowerable_rvalues_visitor *) data;

   /* Add a new stack entry for this instruction */
   stack_entry entry;

   entry.instr = ir;
   entry.state = state->in_assignee ? CANT_LOWER : UNKNOWN;

   state->stack.push_back(entry);
}